

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonReturn(JsonNode *pNode,sqlite3_context *pCtx,sqlite3_value **aReplace)

{
  char cVar1;
  char cVar2;
  u32 uVar3;
  JsonNode *pJVar4;
  char *pcVar5;
  int iVar6;
  double in_RAX;
  u8 *z;
  code *xDel;
  uint n;
  long lVar7;
  uint uVar8;
  i64 iVal;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  char *z_00;
  double r;
  
  switch(pNode->eType) {
  case '\x01':
    iVar6 = 1;
    break;
  case '\x02':
    iVar6 = 0;
    break;
  case '\x03':
    z_00 = (pNode->u).zJContent;
    cVar1 = *z_00;
    lVar7 = 0;
    pcVar5 = z_00 + (cVar1 == '-');
    do {
      cVar2 = *pcVar5;
      if (9 < (byte)(cVar2 - 0x30U)) {
        iVal = -lVar7;
        if (cVar1 != '-') {
          iVal = lVar7;
        }
LAB_001b61d4:
        sqlite3_result_int64(pCtx,iVal);
        return;
      }
      if (0xccccccccccccccb < lVar7) {
        if (((lVar7 != 0xccccccccccccccc) || ((byte)(pcVar5[1] - 0x30U) < 10)) || (cVar2 == '9'))
        goto LAB_001b600d;
        if (cVar2 == '8') {
          if (cVar1 != '-') goto LAB_001b600d;
          iVal = -0x8000000000000000;
          goto LAB_001b61d4;
        }
      }
      lVar7 = lVar7 * 10 + (ulong)(byte)(cVar2 - 0x30U);
      pcVar5 = pcVar5 + 1;
    } while( true );
  case '\x04':
    z_00 = (pNode->u).zJContent;
LAB_001b600d:
    r = in_RAX;
    iVar6 = sqlite3Strlen30(z_00);
    sqlite3AtoF(z_00,&r,iVar6,'\x01');
    sqlite3_result_double(pCtx,r);
    return;
  case '\x05':
    if ((pNode->jnFlags & 2) == 0) {
      z = &((pNode->u).pPatch)->jnFlags;
      n = pNode->n - 2;
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    }
    else {
      uVar3 = pNode->n;
      pJVar4 = (pNode->u).pPatch;
      z = (u8 *)sqlite3_malloc(uVar3 + 1);
      if (z == (u8 *)0x0) {
        sqlite3_result_error_nomem(pCtx);
        return;
      }
      n = 0;
      uVar13 = 1;
      while( true ) {
        uVar14 = (uint)uVar13;
        if (uVar3 - 1 <= uVar14) break;
        bVar10 = (&pJVar4->eType)[uVar13];
        iVar6 = 1;
        uVar8 = n;
        if (bVar10 == 0x5c) {
          bVar10 = (&pJVar4->jnFlags)[uVar13];
          uVar9 = uVar14 + 1;
          if (bVar10 == 0x62) {
            uVar13 = 8;
            uVar14 = uVar9;
          }
          else if (bVar10 == 0x66) {
            uVar13 = 0xc;
            uVar14 = uVar9;
          }
          else if (bVar10 == 0x6e) {
            uVar13 = 10;
            uVar14 = uVar9;
          }
          else if (bVar10 == 0x72) {
            uVar13 = 0xd;
            uVar14 = uVar9;
          }
          else if (bVar10 == 0x75) {
            uVar9 = uVar14 + 5;
            uVar13 = 0;
            for (iVar15 = 0; uVar11 = (uint)uVar13, iVar15 != 4; iVar15 = iVar15 + 1) {
              bVar10 = (&pJVar4->eType)[uVar14 + 2 + iVar15];
              iVar12 = uVar11 * 0x10;
              if ((char)bVar10 < 0x3a) {
                iVar12 = iVar12 + -0x30;
              }
              else if (bVar10 < 0x47) {
                iVar12 = iVar12 + -0x37;
              }
              else {
                iVar12 = iVar12 + -0x57;
              }
              uVar13 = (ulong)(uint)(iVar12 + (char)bVar10);
            }
            if (uVar11 == 0) break;
            uVar14 = uVar9;
            if (0x7f < uVar11) {
              if (uVar11 < 0x800) {
                z[n] = (byte)(uVar11 >> 6) | 0xc0;
                bVar10 = (byte)uVar13 & 0x3f | 0x80;
                iVar6 = 2;
                uVar8 = n + 1;
              }
              else {
                z[n] = (byte)(uVar11 >> 0xc) | 0xe0;
                z[n + 1] = (byte)(uVar13 >> 6) & 0x3f | 0x80;
                bVar10 = (byte)uVar13 & 0x3f | 0x80;
                iVar6 = 3;
                uVar8 = n + 2;
              }
              goto LAB_001b6181;
            }
          }
          else {
            uVar13 = (ulong)bVar10;
            uVar14 = uVar9;
            if (bVar10 == 0x74) {
              uVar13 = 9;
            }
          }
          bVar10 = (byte)uVar13;
        }
LAB_001b6181:
        n = n + iVar6;
        z[uVar8] = bVar10;
        uVar13 = (ulong)(uVar14 + 1);
      }
      z[n] = '\0';
      xDel = sqlite3_free;
    }
    sqlite3_result_text(pCtx,(char *)z,n,xDel);
    return;
  case '\x06':
  case '\a':
    jsonReturnJson(pNode,pCtx,(sqlite3_value **)0x0);
    return;
  default:
    sqlite3_result_null(pCtx);
    return;
  }
  sqlite3_result_int(pCtx,iVar6);
  return;
}

Assistant:

static void jsonReturn(
  JsonNode *pNode,            /* Node to return */
  sqlite3_context *pCtx,      /* Return value for this function */
  sqlite3_value **aReplace    /* Array of replacement values */
){
  switch( pNode->eType ){
    default: {
      assert( pNode->eType==JSON_NULL );
      sqlite3_result_null(pCtx);
      break;
    }
    case JSON_TRUE: {
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSON_FALSE: {
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSON_INT: {
      sqlite3_int64 i = 0;
      const char *z = pNode->u.zJContent;
      if( z[0]=='-' ){ z++; }
      while( z[0]>='0' && z[0]<='9' ){
        unsigned v = *(z++) - '0';
        if( i>=LARGEST_INT64/10 ){
          if( i>LARGEST_INT64/10 ) goto int_as_real;
          if( z[0]>='0' && z[0]<='9' ) goto int_as_real;
          if( v==9 ) goto int_as_real;
          if( v==8 ){
            if( pNode->u.zJContent[0]=='-' ){
              sqlite3_result_int64(pCtx, SMALLEST_INT64);
              goto int_done;
            }else{
              goto int_as_real;
            }
          }
        }
        i = i*10 + v;
      }
      if( pNode->u.zJContent[0]=='-' ){ i = -i; }
      sqlite3_result_int64(pCtx, i);
      int_done:
      break;
      int_as_real: /* fall through to real */;
    }
    case JSON_REAL: {
      double r;
#ifdef SQLITE_AMALGAMATION
      const char *z = pNode->u.zJContent;
      sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
#else
      r = strtod(pNode->u.zJContent, 0);
#endif
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSON_STRING: {
#if 0 /* Never happens because JNODE_RAW is only set by json_set(),
      ** json_insert() and json_replace() and those routines do not
      ** call jsonReturn() */
      if( pNode->jnFlags & JNODE_RAW ){
        sqlite3_result_text(pCtx, pNode->u.zJContent, pNode->n,
                            SQLITE_TRANSIENT);
      }else 
#endif
      assert( (pNode->jnFlags & JNODE_RAW)==0 );
      if( (pNode->jnFlags & JNODE_ESCAPE)==0 ){
        /* JSON formatted without any backslash-escapes */
        sqlite3_result_text(pCtx, pNode->u.zJContent+1, pNode->n-2,
                            SQLITE_TRANSIENT);
      }else{
        /* Translate JSON formatted string into raw text */
        u32 i;
        u32 n = pNode->n;
        const char *z = pNode->u.zJContent;
        char *zOut;
        u32 j;
        zOut = sqlite3_malloc( n+1 );
        if( zOut==0 ){
          sqlite3_result_error_nomem(pCtx);
          break;
        }
        for(i=1, j=0; i<n-1; i++){
          char c = z[i];
          if( c!='\\' ){
            zOut[j++] = c;
          }else{
            c = z[++i];
            if( c=='u' ){
              u32 v = 0, k;
              for(k=0; k<4; i++, k++){
                assert( i<n-2 );
                c = z[i+1];
                assert( safe_isxdigit(c) );
                if( c<='9' ) v = v*16 + c - '0';
                else if( c<='F' ) v = v*16 + c - 'A' + 10;
                else v = v*16 + c - 'a' + 10;
              }
              if( v==0 ) break;
              if( v<=0x7f ){
                zOut[j++] = (char)v;
              }else if( v<=0x7ff ){
                zOut[j++] = (char)(0xc0 | (v>>6));
                zOut[j++] = 0x80 | (v&0x3f);
              }else{
                zOut[j++] = (char)(0xe0 | (v>>12));
                zOut[j++] = 0x80 | ((v>>6)&0x3f);
                zOut[j++] = 0x80 | (v&0x3f);
              }
            }else{
              if( c=='b' ){
                c = '\b';
              }else if( c=='f' ){
                c = '\f';
              }else if( c=='n' ){
                c = '\n';
              }else if( c=='r' ){
                c = '\r';
              }else if( c=='t' ){
                c = '\t';
              }
              zOut[j++] = c;
            }
          }
        }
        zOut[j] = 0;
        sqlite3_result_text(pCtx, zOut, j, sqlite3_free);
      }
      break;
    }
    case JSON_ARRAY:
    case JSON_OBJECT: {
      jsonReturnJson(pNode, pCtx, aReplace);
      break;
    }
  }
}